

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O0

int ps_tobool(FT_Byte **acur,FT_Byte *limit)

{
  byte local_21;
  FT_Byte *pFStack_20;
  FT_Bool result;
  FT_Byte *cur;
  FT_Byte *limit_local;
  FT_Byte **acur_local;
  
  pFStack_20 = *acur;
  if ((((pFStack_20 + 3 < limit) && (*pFStack_20 == 't')) && (pFStack_20[1] == 'r')) &&
     ((pFStack_20[2] == 'u' && (pFStack_20[3] == 'e')))) {
    local_21 = 1;
    pFStack_20 = pFStack_20 + 5;
  }
  else {
    if ((((pFStack_20 + 4 < limit) && ((*pFStack_20 == 'f' && (pFStack_20[1] == 'a')))) &&
        (pFStack_20[2] == 'l')) && ((pFStack_20[3] == 's' && (pFStack_20[4] == 'e')))) {
      pFStack_20 = pFStack_20 + 6;
    }
    local_21 = 0;
  }
  *acur = pFStack_20;
  return (int)local_21;
}

Assistant:

static int
  ps_tobool( FT_Byte*  *acur,
             FT_Byte*   limit )
  {
    FT_Byte*  cur    = *acur;
    FT_Bool   result = 0;


    /* return 1 if we find `true', 0 otherwise */
    if ( cur + 3 < limit &&
         cur[0] == 't'   &&
         cur[1] == 'r'   &&
         cur[2] == 'u'   &&
         cur[3] == 'e'   )
    {
      result = 1;
      cur   += 5;
    }
    else if ( cur + 4 < limit &&
              cur[0] == 'f'   &&
              cur[1] == 'a'   &&
              cur[2] == 'l'   &&
              cur[3] == 's'   &&
              cur[4] == 'e'   )
    {
      result = 0;
      cur   += 6;
    }

    *acur = cur;
    return result;
  }